

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O1

void __thiscall Spc_Dsp::soft_reset_common(Spc_Dsp *this)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  
  (this->m).noise = 0x4000;
  (this->m).echo_offset = 0;
  (this->m).echo_hist_pos = (this->m).echo_hist;
  (this->m).every_other_sample = 1;
  puVar1 = (this->m).counters;
  (this->m).phase = 0;
  (this->m).counters[0] = 1;
  (this->m).counters[1] = 0;
  (this->m).counters[2] = 0xffffffe0;
  (this->m).counters[3] = 0xb;
  iVar2 = 2;
  lVar3 = 0;
  do {
    (this->m).counter_select[lVar3 + 1] = puVar1 + iVar2;
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      iVar2 = 3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1f);
  (this->m).counter_select[0] = puVar1;
  (this->m).counter_select[0x1e] = (this->m).counters + 2;
  return;
}

Assistant:

void Spc_Dsp::soft_reset_common()
{
	require( m.ram ); // init() must have been called already
	
	m.noise              = 0x4000;
	m.echo_hist_pos      = m.echo_hist;
	m.every_other_sample = 1;
	m.echo_offset        = 0;
	m.phase              = 0;
	
	init_counter();
}